

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateAnimMesh.cpp
# Opt level: O3

aiAnimMesh * Assimp::aiCreateAnimMesh(aiMesh *mesh)

{
  char *pcVar1;
  uint uVar2;
  aiVector3D *paVar3;
  void *pvVar4;
  aiAnimMesh *paVar5;
  ulong uVar6;
  aiVector3D *paVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  
  paVar5 = (aiAnimMesh *)operator_new(0x4b0);
  (paVar5->mName).length = 0;
  (paVar5->mName).data[0] = '\0';
  memset((paVar5->mName).data + 1,0x1b,0x3ff);
  memset(&paVar5->mVertices,0,0xa8);
  uVar6 = (ulong)mesh->mNumVertices;
  paVar5->mNumVertices = mesh->mNumVertices;
  paVar3 = mesh->mVertices;
  if (paVar3 != (aiVector3D *)0x0) {
    uVar10 = uVar6 * 0xc;
    paVar7 = (aiVector3D *)operator_new__(uVar10);
    if (uVar6 != 0) {
      memset(paVar7,0,((uVar10 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar5->mVertices = paVar7;
    memcpy(paVar7,paVar3,uVar10);
  }
  paVar3 = mesh->mNormals;
  if (paVar3 != (aiVector3D *)0x0) {
    uVar10 = uVar6 * 0xc;
    paVar7 = (aiVector3D *)operator_new__(uVar10);
    if (uVar6 != 0) {
      memset(paVar7,0,((uVar10 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar5->mNormals = paVar7;
    memcpy(paVar7,paVar3,uVar10);
  }
  paVar3 = mesh->mTangents;
  if (paVar3 != (aiVector3D *)0x0) {
    uVar10 = uVar6 * 0xc;
    paVar7 = (aiVector3D *)operator_new__(uVar10);
    if (uVar6 != 0) {
      memset(paVar7,0,((uVar10 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar5->mTangents = paVar7;
    memcpy(paVar7,paVar3,uVar10);
  }
  paVar3 = mesh->mBitangents;
  if (paVar3 != (aiVector3D *)0x0) {
    uVar10 = uVar6 * 0xc;
    paVar7 = (aiVector3D *)operator_new__(uVar10);
    if (uVar6 != 0) {
      memset(paVar7,0,((uVar10 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar5->mBitangents = paVar7;
    memcpy(paVar7,paVar3,uVar10);
  }
  lVar9 = 0x85;
  do {
    pvVar4 = *(void **)((long)mesh + lVar9 * 8 + -0x3f8);
    if (pvVar4 == (void *)0x0) {
      pcVar1 = (paVar5->mName).data + lVar9 * 8 + -4;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    else {
      uVar2 = paVar5->mNumVertices;
      uVar10 = (ulong)uVar2 << 4;
      pvVar8 = operator_new__(uVar10);
      if ((ulong)uVar2 != 0) {
        memset(pvVar8,0,uVar10);
      }
      *(void **)((paVar5->mName).data + lVar9 * 8 + -4) = pvVar8;
      memcpy(pvVar8,pvVar4,uVar6 << 4);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x8d);
  lVar9 = 0x8d;
  do {
    pvVar4 = *(void **)((long)mesh + lVar9 * 8 + -0x3f8);
    if (pvVar4 == (void *)0x0) {
      pcVar1 = (paVar5->mName).data + lVar9 * 8 + -4;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    else {
      uVar2 = paVar5->mNumVertices;
      uVar10 = (ulong)uVar2 * 0xc;
      pvVar8 = operator_new__(uVar10);
      if ((ulong)uVar2 != 0) {
        memset(pvVar8,0,((uVar10 - 0xc) / 0xc) * 0xc + 0xc);
      }
      *(void **)((paVar5->mName).data + lVar9 * 8 + -4) = pvVar8;
      memcpy(pvVar8,pvVar4,uVar6 * 0xc);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x95);
  return paVar5;
}

Assistant:

aiAnimMesh *aiCreateAnimMesh(const aiMesh *mesh)
{
    aiAnimMesh *animesh = new aiAnimMesh;
    animesh->mNumVertices = mesh->mNumVertices;
    if (mesh->mVertices) {
        animesh->mVertices = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mVertices, mesh->mVertices, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mNormals) {
        animesh->mNormals = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mNormals, mesh->mNormals, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mTangents) {
        animesh->mTangents = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mTangents, mesh->mTangents, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mBitangents) {
        animesh->mBitangents = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mBitangents, mesh->mBitangents, mesh->mNumVertices * sizeof(aiVector3D));
    }

    for (int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
        if (mesh->mColors[i]) {
            animesh->mColors[i] = new aiColor4D[animesh->mNumVertices];
            std::memcpy(animesh->mColors[i], mesh->mColors[i], mesh->mNumVertices * sizeof(aiColor4D));
        } else {
            animesh->mColors[i] = NULL;
        }
    }

    for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
        if (mesh->mTextureCoords[i]) {
            animesh->mTextureCoords[i] = new aiVector3D[animesh->mNumVertices];
            std::memcpy(animesh->mTextureCoords[i], mesh->mTextureCoords[i], mesh->mNumVertices * sizeof(aiVector3D));
        } else {
            animesh->mTextureCoords[i] = NULL;
        }
    }
    return animesh;
}